

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

StringIntMap * __thiscall
glcts::UniformBlocksLayoutBindingCase::UniformBlocksLayoutBindingProgram::getBindingPoints
          (StringIntMap *__return_storage_ptr__,UniformBlocksLayoutBindingProgram *this,
          StringVector *args)

{
  _Rb_tree_header *p_Var1;
  GLint GVar2;
  GLuint GVar3;
  GLenum GVar4;
  undefined8 in_RAX;
  mapped_type_conflict *pmVar5;
  pointer __k;
  GLint value;
  GLenum param;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  _value = in_RAX;
  for (__k = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
      __k != (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
    GVar3 = (*((this->super_LayoutBindingProgram).m_gl)->getProgramResourceIndex)
                      ((((this->super_LayoutBindingProgram).m_program)->m_program).m_program,0x92e2,
                       (__k->_M_dataplus)._M_p);
    if (GVar3 != 0xffffffff) {
      _value = 0x9302ffffffff;
      (*((this->super_LayoutBindingProgram).m_gl)->getProgramResourceiv)
                ((((this->super_LayoutBindingProgram).m_program)->m_program).m_program,0x92e2,GVar3,
                 1,&param,1,(GLsizei *)0x0,&value);
      GVar4 = (*((this->super_LayoutBindingProgram).m_gl)->getError)();
      if (GVar4 == 0) {
        GVar2 = value;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](__return_storage_ptr__,__k);
        *pmVar5 = GVar2;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

StringIntMap getBindingPoints(StringVector args) const
		{
			StringIntMap bindingPoints;

			for (StringVector::iterator it = args.begin(); it != args.end(); it++)
			{
				glw::GLuint idx = gl().getProgramResourceIndex(getProgram(), GL_UNIFORM_BLOCK, (*it).c_str());
				if (idx != glw::GLuint(-1))
				{
					glw::GLenum param = GL_BUFFER_BINDING;
					glw::GLint  value = -1;
					gl().getProgramResourceiv(getProgram(), GL_UNIFORM_BLOCK, idx, 1, &param, 1, NULL, &value);
					bool hasNoError = (GL_NO_ERROR == gl().getError());
					if (hasNoError)
					{
						bindingPoints[*it] = value;
					}
				}
			}

			return bindingPoints;
		}